

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renaming.cpp
# Opt level: O0

TypedTermList Kernel::Renaming::normalize(TypedTermList l)

{
  bool bVar1;
  TermList trm;
  TermList t;
  SortId this;
  TermList TVar2;
  Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> n;
  Renaming *in_stack_ffffffffffffff48;
  TermList in_stack_ffffffffffffff50;
  Term *in_stack_ffffffffffffff58;
  Renaming *in_stack_ffffffffffffff60;
  Term *in_stack_ffffffffffffff80;
  TypedTermList local_20;
  TypedTermList local_10;
  
  bVar1 = TermList::isTerm((TermList *)0x956874);
  if (bVar1) {
    TermList::term((TermList *)0x956887);
    normalize(in_stack_ffffffffffffff80);
    TypedTermList::TypedTermList
              ((TypedTermList *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  else {
    Lib::Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::Recycled
              ((Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
               in_stack_ffffffffffffff50._content);
    Lib::Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::operator->
              ((Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)0x9568c0);
    normalizeVariables(in_stack_ffffffffffffff48,in_stack_ffffffffffffff50);
    Lib::Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::operator->
              ((Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)0x9568f2);
    TypedTermList::sort(&local_20);
    normalizeVariables(in_stack_ffffffffffffff48,in_stack_ffffffffffffff50);
    trm._content = (uint64_t)
                   Lib::Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
                   operator->((Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                               *)0x956935);
    t = apply(in_stack_ffffffffffffff60,trm);
    TVar2 = t;
    Lib::Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::operator->
              ((Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)0x956976);
    this = TypedTermList::sort(&local_20);
    TVar2 = apply(TVar2._content,trm);
    TypedTermList::TypedTermList(&local_10,t,(SortId)TVar2._content);
    Lib::Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::~Recycled
              ((Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
               this._content);
  }
  return local_10;
}

Assistant:

TypedTermList Renaming::normalize(TypedTermList l)
{
  if (l.isTerm()) {
    return TypedTermList(normalize(l.term()));
  } else {
    Recycled<Renaming> n;
    n->normalizeVariables(TermList(l));
    n->normalizeVariables(l.sort());
    return TypedTermList(n->apply(TermList(l)), n->apply(l.sort()));
  }
}